

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t
exr_attr_string_vector_init(exr_context_t ctxt,exr_attr_string_vector_t *sv,int32_t nent)

{
  exr_result_t eVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int32_t i;
  size_t bytes;
  exr_attr_string_t nils;
  exr_attr_string_vector_t nil;
  int local_4c;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  memset(&local_40,0,0x10);
  uVar2 = (long)local_1c << 4;
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_18 == (int *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to string vector object to assign to");
  }
  else if (local_1c < 0) {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,
                         "Received request to allocate negative sized string vector (%d entries)",
                         local_1c);
  }
  else if (uVar2 < 0x80000000) {
    *(undefined8 *)local_18 = local_30;
    *(undefined8 *)(local_18 + 2) = local_28;
    if (uVar2 != 0) {
      uVar3 = (**(code **)(local_10 + 0x58))(uVar2);
      *(undefined8 *)(local_18 + 2) = uVar3;
      if (*(long *)(local_18 + 2) == 0) {
        eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
        return eVar1;
      }
      *local_18 = local_1c;
      local_18[1] = local_1c;
      for (local_4c = 0; local_4c < local_1c; local_4c = local_4c + 1) {
        puVar4 = (undefined8 *)(*(long *)(local_18 + 2) + (long)local_4c * 0x10);
        *puVar4 = local_40;
        puVar4[1] = local_38;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,"Invalid too large size for string vector (%d entries)",local_1c
                        );
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_vector_init (
    exr_context_t ctxt, exr_attr_string_vector_t* sv, int32_t nent)
{
    exr_attr_string_vector_t nil   = {0};
    exr_attr_string_t        nils  = {0};
    size_t                   bytes = (size_t) nent * sizeof (exr_attr_string_t);

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!sv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string vector object to assign to");

    if (nent < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string vector (%d entries)",
            nent);
    if (bytes > (size_t) INT32_MAX)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid too large size for string vector (%d entries)",
            nent);

    *sv = nil;
    if (bytes > 0)
    {
        sv->strings = (exr_attr_string_t*) ctxt->alloc_fn (bytes);
        if (sv->strings == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        sv->n_strings  = nent;
        sv->alloc_size = nent;
        for (int32_t i = 0; i < nent; ++i)
            *(EXR_CONST_CAST (exr_attr_string_t*, (sv->strings + i))) = nils;
    }

    return EXR_ERR_SUCCESS;
}